

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

Value * __thiscall Json::Value::operator[](Value *this,char *key)

{
  iterator iVar1;
  undefined1 *puVar2;
  CZString actualKey;
  CZString local_20;
  
  if (this->field_0x8 == '\0') {
    puVar2 = null;
  }
  else {
    if (this->field_0x8 != '\a') {
      __assert_fail("type_ == nullValue || type_ == objectValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                    ,0x49d,"const Value &Json::Value::operator[](const char *) const");
    }
    CZString::CZString(&local_20,key,noDuplication);
    iVar1 = std::
            _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            ::find(&((this->value_).map_)->_M_t,&local_20);
    if ((_Rb_tree_header *)iVar1._M_node ==
        &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header) {
      puVar2 = null;
    }
    else {
      puVar2 = (undefined1 *)&iVar1._M_node[1]._M_left;
    }
    CZString::~CZString(&local_20);
  }
  return (Value *)puVar2;
}

Assistant:

const Value &
Value::operator[]( const char *key ) const
{
   JSON_ASSERT( type_ == nullValue  ||  type_ == objectValue );
   if ( type_ == nullValue )
      return null;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
   CZString actualKey( key, CZString::noDuplication );
   ObjectValues::const_iterator it = value_.map_->find( actualKey );
   if ( it == value_.map_->end() )
      return null;
   return (*it).second;
#else
   const Value *value = value_.map_->find( key );
   return value ? *value : null;
#endif
}